

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O3

void __thiscall
SchemaConverter::_not_strings(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
string>>const&)::TrieNode::insert(std::__cxx11::string_const__(void *this,string *string)

{
  size_type sVar1;
  pointer pcVar2;
  undefined8 in_RAX;
  size_type sVar3;
  char c;
  undefined8 uStack_28;
  
  sVar1 = string->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (string->_M_dataplus)._M_p;
    sVar3 = 0;
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT17(pcVar2[sVar3],(undefined7)uStack_28);
      this = std::
             map<char,_TrieNode,_std::less<char>,_std::allocator<std::pair<const_char,_TrieNode>_>_>
             ::operator[]((map<char,_TrieNode,_std::less<char>,_std::allocator<std::pair<const_char,_TrieNode>_>_>
                           *)this,(key_type_conflict1 *)((long)&uStack_28 + 7));
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  ((mapped_type *)this)->is_end_of_string = true;
  return;
}

Assistant:

void insert(const std::string & string) {
                auto node = this;
                for (char c : string) {
                    node = &node->children[c];
                }
                node->is_end_of_string = true;
            }